

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<14UL>
mserialize::cx_strcat<5ul,2ul,5ul,2ul>
          (cx_string<5UL> *strings,cx_string<2UL> *strings_1,cx_string<5UL> *strings_2,
          cx_string<2UL> *strings_3)

{
  cx_string<2UL> *in_RCX;
  cx_string<5UL> *in_RDX;
  cx_string<2UL> *in_RSI;
  cx_string<5UL> *in_RDI;
  cx_string<14UL> cVar1;
  size_t s;
  size_t i;
  char *out;
  size_t size [5];
  char *data [5];
  char buffer [15];
  ulong local_b0;
  ulong local_a8;
  char *local_a0;
  size_t local_90 [5];
  char *local_68;
  data_ref local_60;
  data_ref local_58;
  data_ref local_50;
  data_ref local_48;
  char local_3f [15];
  cx_string<2UL> *local_30;
  cx_string<5UL> *local_28;
  cx_string<2UL> *local_20;
  cx_string<5UL> *local_18;
  cx_string<14UL> local_f;
  undefined1 auVar2 [14];
  
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  memset(local_3f,0,0xf);
  local_68 = "";
  local_60 = cx_string<5UL>::data(local_18);
  local_58 = cx_string<2UL>::data(local_20);
  local_50 = cx_string<5UL>::data(local_28);
  local_48 = cx_string<2UL>::data(local_30);
  local_90[0] = cx_string<5UL>::size(local_18);
  local_90[1] = cx_string<2UL>::size(local_20);
  local_90[2] = cx_string<5UL>::size(local_28);
  local_90[3] = cx_string<2UL>::size(local_30);
  local_a0 = local_3f;
  for (local_a8 = 1; local_a8 < 5; local_a8 = local_a8 + 1) {
    for (local_b0 = 0; local_b0 < local_90[local_a8 - 1]; local_b0 = local_b0 + 1) {
      *local_a0 = (&local_68)[local_a8][local_b0];
      local_a0 = local_a0 + 1;
    }
  }
  cx_string<14UL>::cx_string(&local_f,local_3f);
  cVar1._data[0] = local_f._data[0];
  auVar2[1] = local_f._data[1];
  auVar2[2] = local_f._data[2];
  auVar2[3] = local_f._data[3];
  auVar2[4] = local_f._data[4];
  auVar2[5] = local_f._data[5];
  auVar2[6] = local_f._data[6];
  auVar2[7] = local_f._data[7];
  cVar1._data[8] = local_f._data[8];
  cVar1._data[9] = local_f._data[9];
  cVar1._data[10] = local_f._data[10];
  cVar1._data[0xb] = local_f._data[0xb];
  cVar1._data[0xc] = local_f._data[0xc];
  cVar1._data[0xd] = local_f._data[0xd];
  cVar1._data[0xe] = local_f._data[0xe];
  return (cx_string<14UL>)cVar1._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}